

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pulseShape.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  double *pdVar1;
  double dVar2;
  iterator iVar3;
  int iVar4;
  FILE *__stream;
  char *pcVar5;
  ostream *poVar6;
  long lVar7;
  ulong uVar8;
  unsigned_long uVar9;
  unsigned_long uVar10;
  long lVar11;
  result_type rVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  vector<unsigned_long,_std::allocator<unsigned_long>_> num;
  normal_distribution<double> distribution2;
  vector<double,_std::allocator<double>_> S2tot;
  vector<double,_std::allocator<double>_> S1tot;
  vector<double,_std::allocator<double>_> tns;
  vector<double,_std::allocator<double>_> S2max;
  vector<double,_std::allocator<double>_> NonBlank;
  vector<double,_std::allocator<double>_> top;
  vector<double,_std::allocator<double>_> bot;
  vector<double,_std::allocator<double>_> S1f30;
  vector<unsigned_long,_std::allocator<unsigned_long>_> win;
  vector<double,_std::allocator<double>_> T0X;
  vector<double,_std::allocator<double>_> CI_left;
  double e;
  double b;
  double a;
  default_random_engine generator;
  vector<double,_std::allocator<double>_> driftT;
  vector<double,_std::allocator<double>_> S2width;
  vector<double,_std::allocator<double>_> CI_right;
  double d;
  double c;
  char line [60];
  double local_288;
  double local_280;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_278;
  normal_distribution<double> local_258;
  vector<double,_std::allocator<double>_> local_238;
  vector<double,_std::allocator<double>_> local_220;
  void *local_208;
  iterator iStack_200;
  double *local_1f8;
  vector<double,_std::allocator<double>_> local_1f0;
  double local_1d8;
  double local_1d0;
  double *local_1c8;
  iterator iStack_1c0;
  double *local_1b8;
  void *local_1a8;
  iterator iStack_1a0;
  double *local_198;
  void *local_188;
  iterator iStack_180;
  double *local_178;
  double local_168;
  vector<double,_std::allocator<double>_> local_160;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_148;
  vector<double,_std::allocator<double>_> local_130;
  double local_118;
  vector<double,_std::allocator<double>_> local_110;
  double local_f8;
  double local_f0;
  double local_e8;
  linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> local_e0;
  vector<double,_std::allocator<double>_> local_d8;
  vector<double,_std::allocator<double>_> local_c0;
  vector<double,_std::allocator<double>_> local_a8;
  double local_90;
  double local_88;
  double local_80;
  char local_78 [72];
  
  if (verbosity < 2) {
    if (argc < 3) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,
                 "2 args needed: S1 (non-c) in phe (NOT phd). 1st value is min, 2nd max.",0x46);
      std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '\b');
      std::ostream::put('\b');
      std::ostream::flush();
      return 1;
    }
    local_1d0 = atof(argv[1]);
    local_1d8 = atof(argv[2]);
  }
  else {
    local_1d0 = minS1;
    local_1d8 = maxS1;
  }
  local_e0._M_x = 1;
  local_278.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (unsigned_long *)0x0;
  local_278.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (unsigned_long *)0x0;
  local_278.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (unsigned_long *)0x0;
  local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (unsigned_long *)0x0;
  local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (unsigned_long *)0x0;
  local_1f8 = (double *)0x0;
  local_208 = (void *)0x0;
  iStack_200._M_current = (double *)0x0;
  local_178 = (double *)0x0;
  local_188 = (void *)0x0;
  iStack_180._M_current = (double *)0x0;
  local_198 = (double *)0x0;
  local_1a8 = (void *)0x0;
  iStack_1a0._M_current = (double *)0x0;
  __stream = fopen("photon_times.txt","r");
  do {
    iVar4 = getc(__stream);
  } while (iVar4 != 10);
  pcVar5 = fgets(local_78,0x28,__stream);
  if (pcVar5 != (char *)0x0) {
    do {
      if (verbosity < 2) {
        __isoc99_sscanf(local_78,"%lf\t%lf\t%lf\t%lf\t%lf",&local_e8,&local_f0,&local_80,&local_88,
                        &local_f8);
      }
      else {
        __isoc99_sscanf(local_78,"%lf\t%lf",&local_e8,&local_f0);
      }
      iVar4 = feof(__stream);
      if (iVar4 != 0) goto LAB_0010186d;
      local_258._M_param._M_mean =
           (double)((long)(local_e8 - 9.223372036854776e+18) & (long)local_e8 >> 0x3f |
                   (long)local_e8);
      if (local_278.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_278.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_realloc_insert<unsigned_long>
                  (&local_278,
                   (iterator)
                   local_278.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_finish,(unsigned_long *)&local_258);
      }
      else {
        *local_278.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_finish = (unsigned_long)local_258._M_param._M_mean;
        local_278.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_278.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
      }
      if (iStack_200._M_current == local_1f8) {
        std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                  ((vector<double,std::allocator<double>> *)&local_208,iStack_200,&local_f0);
      }
      else {
        *iStack_200._M_current = local_f0;
        iStack_200._M_current = iStack_200._M_current + 1;
      }
      if (verbosity < 2) {
        if (1000.0 < local_f0) {
          local_f8 = 0.0;
        }
        if (iStack_180._M_current == local_178) {
          std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                    ((vector<double,std::allocator<double>> *)&local_188,iStack_180,&local_80);
        }
        else {
          *iStack_180._M_current = local_80;
          iStack_180._M_current = iStack_180._M_current + 1;
        }
        if (iStack_1a0._M_current == local_198) {
          std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                    ((vector<double,std::allocator<double>> *)&local_1a8,iStack_1a0,&local_88);
        }
        else {
          *iStack_1a0._M_current = local_88;
          iStack_1a0._M_current = iStack_1a0._M_current + 1;
        }
        local_258._M_param._M_mean =
             (double)((long)(local_f8 - 9.223372036854776e+18) & (long)local_f8 >> 0x3f |
                     (long)local_f8);
        if (local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
          _M_realloc_insert<unsigned_long>
                    (&local_148,
                     (iterator)
                     local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_finish,(unsigned_long *)&local_258);
        }
        else {
          *local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish = (unsigned_long)local_258._M_param._M_mean;
          local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
      }
      pcVar5 = fgets(local_78,0x28,__stream);
    } while (pcVar5 != (char *)0x0);
  }
  NUMEVT = (unsigned_long)((int)(long)local_e8 + 1);
  if (0x1999999999999999 <
      (NUMEVT * -0x3333333333333333 >> 1 | (ulong)((NUMEVT * -0x3333333333333333 & 1) != 0) << 0x3f)
     ) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Warning! Check to see if last event(s) missing b/c S1=0.\n",
               0x39);
  }
LAB_0010186d:
  fclose(__stream);
  if (verbosity < 2) {
    local_258._M_param._M_mean = 0.0;
    std::vector<double,_std::allocator<double>_>::vector
              (&local_220,NUMEVT,(value_type *)&local_258,(allocator_type *)&local_238);
    local_258._M_param._M_mean = 0.0;
    std::vector<double,_std::allocator<double>_>::vector
              (&local_238,NUMEVT,(value_type *)&local_258,(allocator_type *)&local_1f0);
    local_258._M_param._M_mean = 0.0;
    std::vector<double,_std::allocator<double>_>::vector
              (&local_1f0,NUMEVT,(value_type *)&local_258,(allocator_type *)&local_110);
    local_258._M_param._M_mean = 0.0;
    std::vector<double,_std::allocator<double>_>::vector
              (&local_110,NUMEVT,(value_type *)&local_258,(allocator_type *)&local_a8);
    local_258._M_param._M_mean = 0.0;
    std::vector<double,_std::allocator<double>_>::vector
              (&local_a8,NUMEVT,(value_type *)&local_258,(allocator_type *)&local_c0);
    local_258._M_param._M_mean = 0.0;
    std::vector<double,_std::allocator<double>_>::vector
              (&local_c0,NUMEVT,(value_type *)&local_258,(allocator_type *)&local_160);
    local_258._M_param._M_mean = 0.0;
    std::vector<double,_std::allocator<double>_>::vector
              (&local_160,NUMEVT,(value_type *)&local_258,(allocator_type *)&local_130);
    local_258._M_param._M_mean = 0.0;
    std::vector<double,_std::allocator<double>_>::vector
              (&local_130,NUMEVT,(value_type *)&local_258,(allocator_type *)&local_d8);
    local_258._M_param._M_mean = 0.0;
    std::vector<double,_std::allocator<double>_>::vector
              (&local_d8,NUMEVT,(value_type *)&local_258,(allocator_type *)&local_1c8);
    lVar7 = (long)local_278.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)local_278.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_start >> 3;
    if (local_278.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        local_278.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start) {
      lVar11 = 0;
      do {
        uVar9 = local_278.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start[lVar11];
        local_130.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start[uVar9] = 1.79769313486232e+308;
        pdVar1 = (double *)((long)local_208 + lVar11 * 8);
        dVar16 = *(double *)((long)local_1a8 + lVar11 * 8) +
                 *(double *)((long)local_188 + lVar11 * 8);
        if (1000.0 < *pdVar1 || *pdVar1 == 1000.0) {
          local_238.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[uVar9] =
               dVar16 * 1.015 +
               local_238.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[uVar9];
          dVar16 = *(double *)((long)local_1a8 + lVar11 * 8) +
                   *(double *)((long)local_188 + lVar11 * 8);
          if (local_1f0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[uVar9] <= dVar16 &&
              dVar16 != local_1f0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start[uVar9]) {
            local_1f0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[uVar9] = dVar16;
            local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[uVar9] =
                 *(double *)((long)local_208 + lVar11 * 8) + -1000.0;
          }
        }
        else {
          local_220.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[uVar9] =
               dVar16 + local_220.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start[uVar9];
        }
        lVar11 = lVar11 + 1;
      } while (lVar7 + (ulong)(lVar7 == 0) != lVar11);
    }
    if (local_278.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        local_278.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start) {
      lVar11 = 0;
      dVar16 = 0.0;
      do {
        dVar13 = *(double *)((long)local_208 + lVar11 * 8);
        if (1000.0 <= dVar13) {
          uVar9 = local_278.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_start[lVar11];
          if ((local_c0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[uVar9] == 0.0) &&
             (!NAN(local_c0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar9]))) {
            dVar16 = (*(double *)((long)local_1a8 + lVar11 * 8) +
                     *(double *)((long)local_188 + lVar11 * 8)) * 1.015 + dVar16;
            if (((local_238.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar9] * 0.0225 < dVar16) &&
                (((local_110.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar9] == 0.0 &&
                  (!NAN(local_110.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start[uVar9]))) &&
                 (local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar9] == 0.0)))) &&
               (!NAN(local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar9]))) {
              local_110.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[uVar9] = dVar13;
            }
            if (((local_238.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar9] * 0.5 < dVar16) &&
                (local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar9] == 0.0)) &&
               ((!NAN(local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start[uVar9]) &&
                ((local_110.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar9] != 0.0 ||
                 (NAN(local_110.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start[uVar9]))))))) {
              local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[uVar9] = *(double *)((long)local_208 + lVar11 * 8);
            }
            dVar13 = local_110.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar9];
            if ((dVar13 != 0.0) || (NAN(dVar13))) {
              dVar14 = local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar9];
              if ((dVar14 != 0.0) || (NAN(dVar14))) {
                local_c0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[uVar9] = (dVar14 - dVar13) * 0.5;
                dVar16 = 0.0;
              }
            }
          }
        }
        lVar11 = lVar11 + 1;
      } while (lVar7 + (ulong)(lVar7 == 0) != lVar11);
    }
    local_258._M_param._M_mean = 0.05;
    local_258._M_param._M_stddev = 0.017499999999999998;
    local_258._M_saved = 0.0;
    local_258._M_saved_available = false;
    if (local_278.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        local_278.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start) {
      dVar16 = 0.0;
      uVar8 = 0;
      do {
        pdVar1 = (double *)((long)local_208 + uVar8 * 8);
        if ((*pdVar1 <= 1000.0 && *pdVar1 != 1000.0) &&
           (1.79769313486232e+308 <=
            local_130.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start
            [local_278.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start[uVar8]])) {
          dVar13 = *(double *)((long)local_1a8 + uVar8 * 8);
          dVar14 = *(double *)((long)local_188 + uVar8 * 8);
          rVar12 = std::normal_distribution<double>::operator()
                             (&local_258,&local_e0,&local_258._M_param);
          dVar16 = dVar16 + dVar13 + dVar14;
          dVar13 = 0.0;
          if (0.0 <= rVar12) {
            dVar13 = rVar12;
          }
          uVar9 = local_278.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_start[uVar8];
          if ((dVar13 * local_220.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start[uVar9] < dVar16) &&
             (1.79769313486232e+308 <=
              local_130.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[uVar9])) {
            local_130.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[uVar9] = *(double *)((long)local_208 + uVar8 * 8);
            dVar16 = 0.0;
          }
        }
        uVar8 = uVar8 + 1;
      } while (uVar8 < (ulong)((long)local_278.
                                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_278.
                                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 3));
    }
    if (local_278.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        local_278.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start) {
      dVar16 = 32.0;
      dVar15 = -8.0;
      dVar14 = 134.0;
      dVar13 = -14.0;
      uVar8 = 0;
      local_280 = 0.0;
      local_288 = 0.0;
      do {
        uVar9 = local_278.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start[uVar8];
        if (local_130.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[uVar9] < 1.79769313486232e+308) {
          *(double *)((long)local_208 + uVar8 * 8) =
               *(double *)((long)local_208 + uVar8 * 8) -
               local_130.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[uVar9];
        }
        dVar2 = *(double *)((long)local_208 + uVar8 * 8);
        if ((1000.0 - local_130.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start[uVar9] <= dVar2) ||
           (local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start[uVar8] != 1)) {
          dVar16 = std::
                   generate_canonical<double,53ul,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
                             (&local_e0);
          dVar16 = dVar16 * 20.0 + 0.0 + 0.0;
          dVar13 = dVar16 + -14.0;
          dVar14 = dVar16 + 134.0;
          dVar15 = dVar16 + -8.0;
          dVar16 = dVar16 + 32.0;
          if ((((local_160.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start
                 [local_278.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_start[uVar8]] == 0.0) &&
               (!NAN(local_160.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start
                     [local_278.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start[uVar8]]))) &&
              ((local_288 != 0.0 || (NAN(local_288))))) && ((local_280 != 0.0 || (NAN(local_280)))))
          {
            if ((local_288 != local_280) || (NAN(local_288) || NAN(local_280))) {
              local_160.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start
              [local_278.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start[uVar8]] = local_280 / local_288;
            }
          }
          local_288 = 0.0;
          local_280 = 0.0;
        }
        else if ((dVar13 < dVar2) && (dVar2 < dVar14)) {
          dVar17 = *(double *)((long)local_1a8 + uVar8 * 8) +
                   *(double *)((long)local_188 + uVar8 * 8);
          local_288 = local_288 + dVar17;
          if ((dVar15 < dVar2) && (dVar2 < dVar16)) {
            local_280 = local_280 + dVar17;
          }
        }
        uVar8 = uVar8 + 1;
      } while (uVar8 < (ulong)((long)local_278.
                                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_278.
                                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 3));
    }
    local_1c8 = (double *)0x0;
    iStack_1c0._M_current = (double *)0x0;
    local_1b8 = (double *)0x0;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"evt#\tS1, pe\tpromptFrac\tdrift [ms]\tS2, pe\tWidth [ns]\n",
               0x34);
    if (NUMEVT == 0) {
      iVar4 = 0;
      local_288 = 0.0;
    }
    else {
      lVar7 = 0;
      iVar4 = 0;
      local_288 = 0.0;
      uVar8 = 0;
      do {
        if ((((local_220.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[uVar8] <= local_1d0) ||
             (local_238.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[uVar8] <= 0.0)) ||
            (dVar16 = local_160.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start[uVar8], dVar16 <= 0.0)) ||
           ((1.0 <= dVar16 ||
            (local_1d8 <=
             local_220.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[uVar8])))) {
          poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
          std::ostream::put((char)poVar6);
          std::ostream::flush();
        }
        else {
          poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\t",1);
          poVar6 = std::ostream::_M_insert<double>
                             (local_220.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start[uVar8]);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\t",1);
          poVar6 = std::ostream::_M_insert<double>
                             (local_160.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start[uVar8]);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\t",1);
          poVar6 = std::ostream::_M_insert<double>
                             (local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start[uVar8] / 1000000.0);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\t",1);
          poVar6 = std::ostream::_M_insert<double>
                             (local_238.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start[uVar8]);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\t",1);
          poVar6 = std::ostream::_M_insert<double>
                             (local_c0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start[uVar8]);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
          std::ostream::put((char)poVar6);
          std::ostream::flush();
          local_288 = local_288 + dVar16;
          iVar4 = iVar4 + 1;
          if (iStack_1c0._M_current == local_1b8) {
            std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                      ((vector<double,std::allocator<double>> *)&local_1c8,iStack_1c0,
                       (double *)
                       ((long)local_160.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start + lVar7));
          }
          else {
            *iStack_1c0._M_current =
                 *(double *)
                  ((long)local_160.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start + lVar7);
            iStack_1c0._M_current = iStack_1c0._M_current + 1;
          }
        }
        uVar8 = uVar8 + 1;
        lVar7 = lVar7 + 8;
      } while (uVar8 < NUMEVT);
    }
    iVar3._M_current = iStack_1c0._M_current;
    pdVar1 = local_1c8;
    if (iVar4 == 0) {
      iVar4 = 1;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"no events in range!\n",0x14);
    }
    else {
      if (local_1c8 != iStack_1c0._M_current) {
        uVar8 = (long)iStack_1c0._M_current - (long)local_1c8 >> 3;
        lVar7 = 0x3f;
        if (uVar8 != 0) {
          for (; uVar8 >> lVar7 == 0; lVar7 = lVar7 + -1) {
          }
        }
        std::
        __introsort_loop<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                  (local_1c8,iStack_1c0._M_current,((uint)lVar7 ^ 0x3f) * 2 ^ 0x7e);
        std::
        __final_insertion_sort<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__ops::_Iter_less_iter>
                  (pdVar1,iVar3._M_current);
      }
      local_118 = (double)iVar4;
      local_288 = local_288 / local_118;
      local_168 = 0.0;
      if (NUMEVT != 0) {
        uVar9 = 0;
        do {
          dVar16 = local_160.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar9];
          if (((dVar16 != 0.0) || (NAN(dVar16))) &&
             ((local_1d0 <
               local_220.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[uVar9] &&
              (local_220.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[uVar9] < local_1d8)))) {
            dVar16 = local_288 - dVar16;
            local_168 = local_168 + dVar16 * dVar16;
          }
          uVar9 = uVar9 + 1;
        } while (NUMEVT != uVar9);
      }
      local_90 = local_1c8[iVar4 / 2];
      local_168 = local_168 / (local_118 + -1.0);
      if (local_168 < 0.0) {
        local_168 = sqrt(local_168);
      }
      else {
        local_168 = SQRT(local_168);
      }
      if (NUMEVT == 0) {
        local_280 = 0.0;
      }
      else {
        uVar8 = 0;
        local_280 = 0.0;
        do {
          dVar16 = local_160.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar8];
          if ((((dVar16 != 0.0) || (NAN(dVar16))) &&
              (local_1d0 <
               local_220.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[uVar8])) &&
             (local_220.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[uVar8] < local_1d8)) {
            dVar16 = pow((dVar16 - local_288) / local_168,3.0);
            local_280 = local_280 + dVar16;
          }
          uVar8 = uVar8 + 1;
        } while (uVar8 < NUMEVT);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"MEDIAN\t\tSIGMA\t\tSKEWNESS\n",0x18);
      poVar6 = std::ostream::_M_insert<double>(local_90);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\t",1);
      poVar6 = std::ostream::_M_insert<double>(local_168);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\t",1);
      poVar6 = std::ostream::_M_insert<double>(local_280 / local_118);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
      std::ostream::put((char)poVar6);
      iVar4 = 0;
      std::ostream::flush();
    }
    if (local_1c8 != (double *)0x0) {
      operator_delete(local_1c8,(long)local_1b8 - (long)local_1c8);
    }
    if (local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start != (pointer)0x0) {
      operator_delete(local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_130.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_130.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_130.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_130.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_160.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_160.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_160.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_160.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_c0.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start != (pointer)0x0) {
      operator_delete(local_c0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_c0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_c0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start != (pointer)0x0) {
      operator_delete(local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_110.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_110.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_110.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_110.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_1f0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_1f0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_1f0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_1f0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_238.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_238.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_238.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_238.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_220.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_220.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_220.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_220.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  else {
    local_220.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)&local_258,NUMEVT,(value_type *)&local_220
               ,(allocator_type *)&local_238);
    local_238.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    std::vector<double,_std::allocator<double>_>::vector
              (&local_220,NUMEVT,(value_type *)&local_238,(allocator_type *)&local_1f0);
    local_1f0.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    std::vector<double,_std::allocator<double>_>::vector
              (&local_238,NUMEVT,(value_type *)&local_1f0,(allocator_type *)&local_110);
    local_110.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    std::vector<double,_std::allocator<double>_>::vector
              (&local_1f0,NUMEVT,(value_type *)&local_110,(allocator_type *)&local_a8);
    lVar7 = (long)local_278.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)local_278.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_start >> 3;
    if (local_278.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        local_278.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start) {
      lVar11 = 0;
      do {
        pdVar1 = (double *)((long)local_208 + lVar11 * 8);
        if (*pdVar1 <= 10000.0 && *pdVar1 != 10000.0) {
          uVar9 = local_278.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_start[lVar11];
          local_220.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[uVar9] =
               local_220.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[uVar9] + 1.0;
          *(double *)((long)local_258._M_param._M_mean + uVar9 * 8) =
               *(double *)((long)local_208 + lVar11 * 8) +
               *(double *)((long)local_258._M_param._M_mean + uVar9 * 8);
        }
        lVar11 = lVar11 + 1;
      } while (lVar7 + (ulong)(lVar7 == 0) != lVar11);
    }
    uVar9 = NUMEVT;
    if (NUMEVT != 0) {
      uVar10 = 0;
      do {
        *(double *)((long)local_258._M_param._M_mean + uVar10 * 8) =
             *(double *)((long)local_258._M_param._M_mean + uVar10 * 8) /
             local_220.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[uVar10];
        uVar10 = uVar10 + 1;
      } while (uVar9 != uVar10);
    }
    if (local_278.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        local_278.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start) {
      lVar11 = 0;
      do {
        uVar9 = local_278.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start[lVar11];
        dVar16 = *(double *)((long)local_208 + lVar11 * 8) -
                 *(double *)((long)local_258._M_param._M_mean + uVar9 * 8);
        *(double *)((long)local_208 + lVar11 * 8) = dVar16;
        if (ABS(dVar16) <= 200.0) {
          local_238.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[uVar9] =
               local_238.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[uVar9] + 1.0;
        }
        dVar16 = *(double *)((long)local_208 + lVar11 * 8);
        if ((-69.7 <= dVar16) && (dVar16 <= 196.2)) {
          local_1f0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[uVar9] =
               local_1f0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[uVar9] + 1.0;
        }
        lVar11 = lVar11 + 1;
      } while (lVar7 + (ulong)(lVar7 == 0) != lVar11);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"evt#\tpromptFrac",0xf)
    ;
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
    std::ostream::put(-0x58);
    std::ostream::flush();
    if (NUMEVT != 0) {
      uVar8 = 0;
      do {
        local_288 = 0.0;
        if (0.0 < local_238.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar8]) {
          local_288 = local_1f0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start[uVar8] /
                      local_238.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start[uVar8];
        }
        poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\t",1);
        poVar6 = std::ostream::_M_insert<double>(local_288);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
        std::ostream::put((char)poVar6);
        std::ostream::flush();
        uVar8 = uVar8 + 1;
      } while (uVar8 < NUMEVT);
    }
    if (local_1f0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_1f0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_1f0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_1f0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_238.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_238.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_238.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_238.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_220.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_220.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_220.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_220.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if ((void *)local_258._M_param._M_mean != (void *)0x0) {
      operator_delete((void *)local_258._M_param._M_mean,
                      (long)local_258._M_saved - (long)local_258._M_param._M_mean);
    }
    iVar4 = 0;
  }
  if (local_1a8 != (void *)0x0) {
    operator_delete(local_1a8,(long)local_198 - (long)local_1a8);
  }
  if (local_188 != (void *)0x0) {
    operator_delete(local_188,(long)local_178 - (long)local_188);
  }
  if (local_208 != (void *)0x0) {
    operator_delete(local_208,(long)local_1f8 - (long)local_208);
  }
  if (local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_148.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_148.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_278.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (unsigned_long *)0x0) {
    operator_delete(local_278.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_278.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_278.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return iVar4;
}

Assistant:

int main ( int argc, char** argv ) {
  
  double S1LimPE[2] = { minS1, maxS1 };
  
  if ( verbosity < 2 ) {
    if ( argc < 3 ) {
      cerr << "2 args needed: S1 (non-c) in phe (NOT phd). 1st value is min, 2nd "
	      "max."
	   << endl;
      return EXIT_FAILURE;
    }
    else {
      S1LimPE[0] = atof(argv[1]); S1LimPE[1] = atof(argv[2]);  // avoid Seg Fault!
    }
  }
  
  double MaxPossibleTime = DBL_MAX; default_random_engine generator;
  uniform_real_distribution<double> distribution(
      0., 20.);  // ns for ran offset. 2 bin default. For Case: -7,0
  // for LUX Run03: better results with -4 to 16. Still 2 samples-wide, but
  // different centering
  vector<uint64_t> num, win;
  char line[60];
  vector<double> tns, bot, top;
  FILE* ifp = fopen("photon_times.txt", "r");
  double a, b, c, d, e;
  uint64_t i = 0;

  while (1) {
    if (i == 0) {
      while (getc(ifp) != '\n') {
        ;
      }
      i = 1;
      continue;
    }
    if (fgets(line, 40, ifp) == NULL) {
      NUMEVT = unsigned(a) + 1;
      if ( NUMEVT % 10 )
        cerr << "Warning! Check to see if last event(s) missing b/c S1=0.\n";
      break;
    } else ;
    if ( verbosity < 2 )
      sscanf(line, "%lf\t%lf\t%lf\t%lf\t%lf", &a, &b, &c, &d, &e);
    else
      sscanf(line, "%lf\t%lf", &a, &b);
    if (feof(ifp)) break;
    num.push_back(uint64_t(a));
    tns.push_back(b);
    if ( verbosity < 2 ) {
      if (b > S2BORD) e = 0;
      bot.push_back(c);
      top.push_back(d);
      win.push_back(uint64_t(e));
    }
    // cerr << a << " " << b << " " << c << " " << d << " " << e << endl;
  }
  fclose(ifp);
  
  if ( verbosity >= 2 ) { //for pseudo-S1-only spike mode
    double range[4] = {-200., 200., -69.7, 196.2};
    vector<double> means(NUMEVT, 0.);
    vector<double> count(NUMEVT, 0.);
    vector<double> S1total(NUMEVT, 0.);
    vector<double> S1inner(NUMEVT, 0.);
    for ( i = 0; i < num.size(); ++i ) {
      if ( tns[i] < 1e4 ) {
	++count[num[i]];
	means[num[i]] += tns[i];
      }
    }
    for ( i = 0; i < NUMEVT; ++i ) means[i] /= count[i];
    for ( i = 0; i < num.size(); ++i ) {
      tns[i] -= means[num[i]]; //correction on means
      if ( tns[i] >= range[0] && tns[i] <= range[1] )
	++S1total[num[i]];
      if ( tns[i] >= range[2] && tns[i] <= range[3] )
	++S1inner[num[i]];
    }
    cout << "evt#\tpromptFrac" << endl;
    for ( i = 0; i < NUMEVT; ++i ) {
      double promptFrac = 0.0;
      if ( S1total[i] > 0. )
	promptFrac = S1inner[i] / S1total[i];
      cout << i << "\t" << promptFrac << endl;
    }
    return EXIT_SUCCESS;
  }
  
  vector<double> S1tot(NUMEVT, 0.);
  vector<double> S2tot(NUMEVT, 0.);
  vector<double> S2max(NUMEVT, 0.);
  vector<double> CI_left(NUMEVT, 0.);
  vector<double> CI_right(NUMEVT, 0.);
  vector<double> S2width(NUMEVT, 0.);
  vector<double> S1f30(NUMEVT, 0.);
  vector<double> T0X(NUMEVT, 0.);
  vector<double> driftT(NUMEVT, 0.);

  for (i = 0; i < num.size(); ++i) {
    T0X[num[i]] = MaxPossibleTime;
    if (tns[i] < S2BORD)
      S1tot[num[i]] += top[i] + bot[i];
    else {
      S2tot[num[i]] += (top[i] + bot[i]) * LOSTAREA;
      if ((top[i] + bot[i]) > S2max[num[i]]) {
        S2max[num[i]] = top[i] + bot[i];
        driftT[num[i]] =
            tns[i] -
            S2BORD;  // minus 1 microsecond fudge factor to get mean drift
      } else
        ;
    }
  }
  double fraction = 0.0225,
         soFar = 0.;  // default Confidence Interval is 95.5% (~2-sigma)
  for (i = 0; i < num.size(); ++i) {
    if (tns[i] >= S2BORD && S2width[num[i]] == 0.) {
      soFar += (top[i] + bot[i]) * LOSTAREA;
      if (soFar > fraction * S2tot[num[i]] && CI_left[num[i]] == 0. &&
          CI_right[num[i]] == 0.)
        CI_left[num[i]] = tns[i];
      if (soFar > 0.500000 * S2tot[num[i]] && CI_right[num[i]] == 0. &&
          CI_left[num[i]] != 0.)
        CI_right[num[i]] = tns[i];  // left half only because of asymmetry
      if (CI_left[num[i]] != 0. && CI_right[num[i]] != 0.) {
        S2width[num[i]] = (CI_right[num[i]] - CI_left[num[i]]) / 2.;
        soFar = 0.0;
        continue;
      }  // div by 2 as 1s--1s=2sigma
    }
  }
  soFar = 0.00;
  normal_distribution<double> distribution2(RISEDEF, RISEDEF * UNC);
  for (i = 0; i < num.size(); ++i) {
    if (tns[i] < S2BORD && T0X[num[i]] >= MaxPossibleTime) {
      soFar += top[i] + bot[i];
      fraction = distribution2(generator);
      if (fraction < 0.) fraction = 0.;
      if (soFar > (fraction * S1tot[num[i]]) &&
          T0X[num[i]] >= MaxPossibleTime) {
        T0X[num[i]] = tns[i]; //time of "actual" S1 peak start
        soFar = 0.0;
        continue;
      }
    }
  }

  double area[2] = {0.0, 0.0};
  double range[4] = {-14., 134., -8., 32.};
  double rRange[4] = {range[0], range[1], range[2],
                      range[3]};  // Dahl: -50,300,-50,10
  for (i = 0; i < num.size(); ++i) {
    if (T0X[num[i]] < MaxPossibleTime) tns[i] -= T0X[num[i]];
    if (tns[i] < (S2BORD - T0X[num[i]]) && win[i] == 1) {
      if (tns[i] > rRange[0] && tns[i] < rRange[1]) {
        area[0] += top[i] + bot[i];
        if (tns[i] > rRange[2] && tns[i] < rRange[3])
          area[1] += top[i] + bot[i];
      }
    } else {
      double offset0 =
          0.0 +
          distribution(generator);  // consider unique offset for each
                                    // range[]. In original try makes bumps
      // double offset1 = 10.+distribution(generator);
      // double offset2 = 10.+distribution(generator);
      // double offset3 = 10.+distribution(generator);
      // randomized offset was to create extra smearing to better match real data with unknowns in the DAQ
      rRange[0] = range[0] + offset0;
      rRange[1] = range[1] + offset0;
      rRange[2] = range[2] + offset0;
      rRange[3] = range[3] + offset0;
      if (S1f30[num[i]] == 0. && area[0] != 0. && area[1] != 0. &&
          area[0] != area[1])
        S1f30[num[i]] = area[1] / area[0];
      area[0] = 0.0;
      area[1] = 0.0;
    }
  }

  double mean = 0.0;
  int j = 0;
  vector<double> NonBlank;
  cout << "evt#\tS1, pe\tpromptFrac\tdrift [ms]\tS2, pe\tWidth [ns]\n";
  for (i = 0; i < NUMEVT; ++i) {
    // cerr << T0X[i] << endl;
    if (S1tot[i] > S1LimPE[0] && S2tot[i] > 0. && S1f30[i] > 0. &&
        S1f30[i] < 1. && S1tot[i] < S1LimPE[1]) {
      mean += S1f30[i];
      ++j;
      cout << i << "\t" << S1tot[i] << "\t" << S1f30[i] << "\t"
           << driftT[i] / 1e6 << "\t" << S2tot[i] << "\t" << S2width[i] << endl;
      NonBlank.push_back(S1f30[i]);
    } else
      cout << i << endl;
  }
  if (j == 0) {
    cerr << "no events in range!\n";
    return EXIT_FAILURE;
  }
  mean /= double(j);
  std::sort(NonBlank.begin(), NonBlank.end());
  double median = NonBlank[j / 2];

  double sigma = 0.0;
  for (i = 0; i < NUMEVT; ++i)
    if (S1f30[i] != 0. && S1tot[i] > S1LimPE[0] && S1tot[i] < S1LimPE[1])
      sigma += (mean - S1f30[i]) * (mean - S1f30[i]);
  sigma /= (double(j) - 1.);
  sigma = sqrt(sigma);
  double skew = 0.0;
  for (i = 0; i < NUMEVT; ++i)
    if (S1f30[i] != 0. && S1tot[i] > S1LimPE[0] && S1tot[i] < S1LimPE[1])
      skew += pow((S1f30[i] - mean) / sigma, 3.);
  skew /= double(j);
  cerr << "MEDIAN\t\tSIGMA\t\tSKEWNESS\n";
  cerr << median << "\t" << sigma << "\t" << skew
       << endl;  // can switch to "mean," as desired, but change the header name
                 // too :)
  
  return EXIT_SUCCESS;
  
}